

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O0

int64_t decNumberIntegralToInt64(decNumber_conflict *dn,decContext *set)

{
  ulong uVar1;
  ulong local_50;
  uint64_t prev;
  uint64_t prev_1;
  uint64_t hi;
  uint16_t *up;
  int64_t d;
  decContext *set_local;
  decNumber_conflict *dn_local;
  
  if ((((dn->bits & 0x70) == 0) && (-1 < dn->exponent)) && (dn->digits + dn->exponent < 0x14)) {
    prev_1 = 0;
    hi = (uint64_t)dn->lsu;
    for (up = (uint16_t *)&DAT_00000001; (long)up <= (long)dn->digits;
        up = (uint16_t *)((long)up + 3)) {
      uVar1 = (ulong)*(ushort *)hi * DECPOWERS[(long)up + -1] + prev_1;
      if ((uVar1 < prev_1) || (0x7fffffffffffffff < uVar1)) goto LAB_00fa3e33;
      hi = hi + 2;
      prev_1 = uVar1;
    }
    local_50 = DECPOWERS[dn->exponent] * prev_1;
    if ((prev_1 <= local_50) && (local_50 < 0x8000000000000000)) {
      if ((dn->bits & 0x80) != 0) {
        local_50 = -local_50;
      }
      return local_50;
    }
  }
LAB_00fa3e33:
  decContextSetStatus(set,0x80);
  return 0;
}

Assistant:

int64_t decNumberIntegralToInt64(const decNumber *dn, decContext *set)
{
    if (decNumberIsSpecial(dn) || (dn->exponent < 0) ||
       (dn->digits + dn->exponent > 19)) {
        goto Invalid;
    } else {
        int64_t d;        /* work */
        const Unit *up;   /* .. */
        uint64_t hi = 0;
        up = dn->lsu;     /* -> lsu */

        for (d = 1; d <= dn->digits; up++, d += DECDPUN) {
            uint64_t prev = hi;
            hi += *up * powers[d-1];
            if ((hi < prev) || (hi > INT64_MAX)) {
                goto Invalid;
            }
        }

        uint64_t prev = hi;
        hi *= (uint64_t)powers[dn->exponent];
        if ((hi < prev) || (hi > INT64_MAX)) {
            goto Invalid;
        }
        return (decNumberIsNegative(dn)) ? -((int64_t)hi) : (int64_t)hi;
    }

Invalid:
    decContextSetStatus(set, DEC_Invalid_operation);
    return 0;
}